

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1521.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  undefined8 in_RAX;
  istream *this;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int n;
  int k;
  undefined8 local_38;
  
  local_38 = in_RAX;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_38);
  std::istream::operator>>(this,(int *)((long)&local_38 + 4));
  iVar10 = maxn;
  if (0 < (int)local_38) {
    iVar3 = 0;
    do {
      uVar8 = iVar10 + iVar3;
      if (uVar8 != 0 && SCARRY4(iVar10,iVar3) == (int)uVar8 < 0) {
        uVar7 = (ulong)uVar8;
        do {
          t[uVar8] = t[uVar8] + 1;
          uVar7 = uVar7 >> 1;
          bVar1 = 1 < uVar8;
          uVar8 = (uint)uVar7;
        } while (bVar1);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != (int)local_38);
  }
  if (0 < (int)local_38) {
    iVar10 = local_38._4_4_ + -1;
    uVar8 = 0;
    do {
      iVar3 = maxn;
      uVar9 = 1;
      if (1 < maxn) {
        iVar4 = iVar10 + 1;
        uVar9 = 1;
        do {
          iVar5 = t[(int)(uVar9 * 2)];
          uVar9 = (uint)(iVar5 < iVar4) + uVar9 * 2;
          if (iVar4 <= iVar5) {
            iVar5 = 0;
          }
          iVar4 = iVar4 - iVar5;
        } while ((int)uVar9 < maxn);
      }
      if (0 < (int)uVar9) {
        uVar7 = (ulong)uVar9;
        do {
          uVar6 = (uint)uVar7;
          t[uVar7] = t[uVar7] + -1;
          uVar7 = uVar7 >> 1;
        } while (1 < uVar6);
      }
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uVar9 - iVar3) + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      if ((int)uVar8 < (int)local_38 + -1) {
        iVar10 = (local_38._4_4_ + iVar10 + -1) % (int)((int)local_38 + ~uVar8);
      }
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < (int)local_38);
  }
  return 0;
}

Assistant:

int main() {

    int n, k;
    std::cin >> n >> k;
    for (int i = 0; i < n; ++i) {
        update(i, 1);
//        for(int &item : t){
//            std::cout << item << " ";
//        }
//        std::cout << "\n";
    }
    int currPos = k - 1;
//    std::cout << "====================\n";

    for (int i = 0; i < n; ++i) {
        int pos = find_kth(1, currPos + 1);
        update(pos, -1);
//        for(int &item : t){
//            std::cout << item << " ";
//        }
//        std::cout << "\n";
        std::cout << pos + 1 << " ";
        if (i < n - 1)
            currPos = (currPos - 1 + k) % (n - i - 1);
    }
    return 0;
}